

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetFileArtifact<ArtifactLinkerFileSuffixTag>::Evaluate
          (string *__return_storage_ptr__,TargetFileArtifact<ArtifactLinkerFileSuffixTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  cmGeneratorTarget *this_00;
  string local_38;
  
  this_00 = TargetArtifactBase::GetTarget
                      (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    TargetFileArtifactResultGetter<ArtifactLinkerFileSuffixTag>::Get_abi_cxx11_
              (&local_38,(TargetFileArtifactResultGetter<ArtifactLinkerFileSuffixTag> *)this_00,
               (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,
               (GeneratorExpressionContent *)dagChecker);
    bVar1 = context->HadError;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1 == false) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_38.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_38.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_38._M_string_length;
    }
    else {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }

    std::string result =
      TargetFileArtifactResultGetter<ArtifactT>::Get(target, context, content);
    if (context->HadError) {
      return std::string();
    }
    return result;
  }